

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

void Js::RegexHelper::PrimBeginMatch
               (RegexMatchState *state,ScriptContext *scriptContext,RegexPattern *pattern,
               char16 *input,CharCount inputLength,bool alwaysNeedAlloc)

{
  Matcher *ptr;
  TempArenaAllocatorObject *pTVar1;
  
  state->input = input;
  if ((pattern->rep).unified.matcher.ptr == (Matcher *)0x0) {
    ptr = UnifiedRegex::Matcher::New(scriptContext,pattern);
    Memory::WriteBarrierPtr<UnifiedRegex::Matcher>::WriteBarrierSet
              (&(pattern->rep).unified.matcher,ptr);
  }
  if (alwaysNeedAlloc) {
    pTVar1 = ScriptContext::GetTemporaryAllocator(scriptContext,L"RegexUnifiedExecTemp");
  }
  else {
    pTVar1 = (TempArenaAllocatorObject *)0x0;
  }
  state->tempAllocatorObj = pTVar1;
  return;
}

Assistant:

void RegexHelper::PrimBeginMatch(RegexMatchState& state, ScriptContext* scriptContext, UnifiedRegex::RegexPattern* pattern, const char16* input, CharCount inputLength, bool alwaysNeedAlloc)
    {
        state.input = input;
        if (pattern->rep.unified.matcher == 0)
            pattern->rep.unified.matcher = UnifiedRegex::Matcher::New(scriptContext, pattern);
        if (alwaysNeedAlloc)
            state.tempAllocatorObj = scriptContext->GetTemporaryAllocator(_u("RegexUnifiedExecTemp"));
        else
            state.tempAllocatorObj = 0;
    }